

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructBuilder
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  NormalizedName_abi_cxx11_(&local_88,this,&struct_def->super_Definition);
  std::operator+(&local_68,"def Create",&local_88);
  std::operator+(&local_48,&local_68,"(b_:flatbuffers.builder");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  StructBuilderArgs(this,(StructDef *)code_ptr_local,"",code);
  std::__cxx11::string::operator+=((string *)local_28,"):\n");
  StructBuilderBody(this,(StructDef *)code_ptr_local,"",code);
  std::__cxx11::string::operator+=((string *)local_28,"    return b_.Offset()\n\n");
  return;
}

Assistant:

void GenStructBuilder(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code +=
        "def Create" + NormalizedName(struct_def) + "(b_:flatbuffers.builder";
    StructBuilderArgs(struct_def, "", code_ptr);
    code += "):\n";
    StructBuilderBody(struct_def, "", code_ptr);
    code += "    return b_.Offset()\n\n";
  }